

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlParserInputBufferRead(xmlParserInputBufferPtr in,int len)

{
  int iVar1;
  
  if ((in != (xmlParserInputBufferPtr)0x0) && (in->error == 0)) {
    if (in->readcallback == (xmlInputReadCallback)0x0) {
      iVar1 = xmlBufGetAllocationScheme(in->buffer);
      return -(uint)(iVar1 != 2);
    }
    iVar1 = xmlParserInputBufferGrow(in,len);
    return iVar1;
  }
  return -1;
}

Assistant:

int
xmlParserInputBufferRead(xmlParserInputBufferPtr in, int len) {
    if ((in == NULL) || (in->error)) return(-1);
    if (in->readcallback != NULL)
	return(xmlParserInputBufferGrow(in, len));
    else if (xmlBufGetAllocationScheme(in->buffer) == XML_BUFFER_ALLOC_IMMUTABLE)
	return(0);
    else
        return(-1);
}